

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseReference
                 (char *in,char *end,
                 vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *names)

{
  Name *nextName;
  Name *local_28;
  
  if (in != end && in != (char *)0x0) {
    local_28 = (Name *)0x0;
    in = parseName(in,end,&local_28);
    while( true ) {
      if (local_28 != (Name *)0x0) {
        std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::push_back
                  (names,&local_28);
      }
      if ((*in != ',') || (in = getNextSeparator<char>(in,end), *in != ',')) break;
      in = parseName(in,end,&local_28);
    }
  }
  return in;
}

Assistant:

char *OpenDDLParser::parseReference( char *in, char *end, std::vector<Name*> &names ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    Name *nextName( ddl_nullptr );
    in = parseName( in, end, &nextName );
    if( nextName ) {
        names.push_back( nextName );
    }
    while( Grammar::CommaSeparator[ 0 ] == *in ) {
        in = getNextSeparator( in, end );
        if( Grammar::CommaSeparator[ 0 ] == *in ) {
            in = parseName( in, end, &nextName );
            if( nextName ) {
                names.push_back( nextName );
            }
        } else {
            break;
        }
    }

    return in;
}